

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,SCmpREInstr *scmpre)

{
  pointer ppVVar1;
  Value *pVVar2;
  long lVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  RegExp RStack_68;
  
  ppVVar1 = (scmpre->super_Instr).operands_.
            super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar2 = ppVVar1[1];
  if (pVVar2 == (Value *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(pVVar2,&Value::typeinfo,
                           &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::typeinfo,0);
  }
  if (lVar3 != 0) {
    emitLoad(this,*ppVVar1);
    util::RegExp::RegExp(&RStack_68,(RegExp *)(lVar3 + 0x48));
    sVar4 = ConstantPool::makeRegExp(&this->cp_,&RStack_68);
    emitInstr(this,SREGMATCH,(Operand)sVar4);
    util::RegExp::~RegExp(&RStack_68);
    changeStack(this,1,(Value *)scmpre);
    return;
  }
  visit();
  util::RegExp::~RegExp(&RStack_68);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TargetCodeGenerator::visit(SCmpREInstr& scmpre) {
  auto re = dynamic_cast<ConstantRegExp*>(scmpre.operand(1));
  FLOW_ASSERT(re != nullptr, "flow: RHS must be a ConstantRegExp");

  emitLoad(scmpre.operand(0));
  emitInstr(Opcode::SREGMATCH, cp_.makeRegExp(re->get()));
  changeStack(1, &scmpre);
}